

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::Finalize<duckdb::BoolState,bool,duckdb::BoolAndFunFunction>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  BoolState *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  bool *rdata_1;
  BoolState **sdata_1;
  AggregateFinalizeData finalize_data;
  bool *rdata;
  BoolState **sdata;
  bool *in_stack_ffffffffffffff78;
  BoolState *in_stack_ffffffffffffff80;
  BoolState *state;
  AggregateFinalizeData local_78;
  bool *local_60;
  BoolState **local_58;
  AggregateFinalizeData local_50;
  bool *local_38;
  BoolState **local_30;
  long local_28;
  BoolState *local_20;
  Vector *local_18;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::GetData<duckdb::BoolState*>((Vector *)0x9ae350);
    local_38 = ConstantVector::GetData<bool>((Vector *)0x9ae35f);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,local_18,local_10);
    BoolAndFunFunction::Finalize<bool,duckdb::BoolState>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x9ae38f
              );
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_58 = FlatVector::GetData<duckdb::BoolState*>((Vector *)0x9ae3ad);
    local_60 = FlatVector::GetData<bool>((Vector *)0x9ae3bc);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,local_18,local_10);
    for (state = (BoolState *)0x0; state < local_20; state = (BoolState *)&state->val) {
      local_78.result_idx = (idx_t)(&state->empty + local_28);
      BoolAndFunFunction::Finalize<bool,duckdb::BoolState>
                (state,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x9ae41b);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}